

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O1

void __thiscall Holding::~Holding(Holding *this)

{
  ~Holding(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

Holding::~Holding()
{
    delete subHolding;
    delete upperHolding;
}